

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O2

CURLcode Curl_trc_opt(char *config)

{
  undefined8 *puVar1;
  int iVar2;
  CURLcode CVar3;
  char *__s;
  char *first;
  long lVar4;
  int lvl;
  char *local_38;
  
  if (config == (char *)0x0) {
    return CURLE_OK;
  }
  __s = (*Curl_cstrdup)(config);
  if (__s == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    first = strtok_r(__s,", ",&local_38);
    while (first != (char *)0x0) {
      if (*first == '+') {
        first = first + 1;
LAB_00120763:
        lvl = 1;
      }
      else {
        if (*first != '-') goto LAB_00120763;
        first = first + 1;
        lvl = 0;
      }
      iVar2 = curl_strequal(first,"all");
      if (iVar2 == 0) {
        iVar2 = curl_strequal(first,"protocol");
        if (iVar2 != 0) {
          iVar2 = 1;
          goto LAB_001207bd;
        }
        iVar2 = curl_strequal(first,"network");
        if (iVar2 != 0) {
          iVar2 = 2;
          goto LAB_001207bd;
        }
        iVar2 = curl_strequal(first,"proxy");
        if (iVar2 != 0) {
          iVar2 = 4;
          goto LAB_001207bd;
        }
        lVar4 = 0;
        do {
          if (lVar4 + 0x10 == 0xe0) goto LAB_0012080e;
          puVar1 = *(undefined8 **)((long)&trc_cfts[0].cft + lVar4);
          iVar2 = curl_strequal(first,(char *)*puVar1);
          lVar4 = lVar4 + 0x10;
        } while (iVar2 == 0);
        *(int *)((long)puVar1 + 0xc) = lvl;
LAB_0012080e:
        lVar4 = 0;
        do {
          if (lVar4 + 0x10 == 0x70) goto LAB_001207c4;
          puVar1 = *(undefined8 **)((long)&trc_feats[0].feat + lVar4);
          iVar2 = curl_strequal(first,(char *)*puVar1);
          lVar4 = lVar4 + 0x10;
        } while (iVar2 == 0);
        *(int *)(puVar1 + 1) = lvl;
      }
      else {
        iVar2 = 0;
LAB_001207bd:
        trc_apply_level_by_category(iVar2,lvl);
      }
LAB_001207c4:
      first = strtok_r((char *)0x0,", ",&local_38);
    }
    (*Curl_cfree)(__s);
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_trc_opt(const char *config)
{
  CURLcode result = config ? trc_opt(config) : CURLE_OK;
#ifdef DEBUGBUILD
  /* CURL_DEBUG can override anything */
  if(!result) {
    const char *dbg_config = getenv("CURL_DEBUG");
    if(dbg_config)
      result = trc_opt(dbg_config);
  }
#endif /* DEBUGBUILD */
  return result;
}